

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

void a__GLTexureUpload1D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  
  iVar1 = data->x;
  if (iVar1 < 1) {
    pvVar4 = data->pixels;
  }
  else {
    pvVar4 = (void *)0x0;
  }
  uVar5 = tf._0_8_ >> 0x20;
  iVar3 = data->width + iVar1;
  iVar2 = tex->width;
  if (binding != 0xde0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3e4,"binding == GL_TEXTURE_1D");
    aAppTerminate(-1);
  }
  if (iVar2 < iVar3 || pvVar4 != (void *)0x0) {
    glTexImage1D(binding,0,tf._0_8_ & 0xffffffff,iVar3,0,uVar5,tf.type,pvVar4);
    tex->width = iVar3;
  }
  if (0 < iVar1) {
    if (data->pixels == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x3ed,"data->pixels");
      aAppTerminate(-1);
    }
    glTexSubImage1D(binding,0,data->x,data->width,uVar5,tf.type,data->pixels);
  }
  return;
}

Assistant:

static void a__GLTexureUpload1D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;

	const int expand = maxwidth > tex->width;
	const int is_subimage = data->x > 0;
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_1D);

	if (expand || to_upload) {
		AGL__CALL(glTexImage1D(binding, 0, tf.internal, maxwidth, 0,
			tf.format, tf.type, to_upload));
		tex->width = maxwidth;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage1D(binding, 0,
			data->x, data->width,
			tf.format, tf.type, data->pixels));
	}
}